

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O0

Real __thiscall amrex::MultiFab::norm2(MultiFab *this,int comp,Periodicity *period)

{
  int iVar1;
  bool bVar2;
  int in_ESI;
  undefined8 in_RDI;
  undefined1 do_tiling_;
  double dVar3;
  Real tmp;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Periodicity *in_stack_000000a0;
  MultiFab *in_stack_000000a8;
  Array4<const_double> *m;
  Array4<const_double> *a;
  Box *bx;
  MFIter mfi;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> mask;
  Real nm2;
  undefined8 in_stack_fffffffffffffd48;
  MPI_Comm comm;
  MFIter *in_stack_fffffffffffffd50;
  FabArray<amrex::FArrayBox> *this_00;
  FabArrayBase *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  int iVar4;
  int local_278;
  int local_274;
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> in_stack_fffffffffffffdb0;
  long local_230;
  long local_228;
  long local_220;
  int local_210;
  int local_20c;
  int local_208;
  long *local_1f0;
  undefined1 local_1e8 [104];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_180;
  MFIter local_168;
  double local_100;
  int local_ec;
  FabArrayBase *local_e0;
  int local_d8;
  MFIter *local_d0;
  int local_c4;
  int iStack_c0;
  int local_bc;
  MultiArray4<const_double> local_b8;
  int local_b0;
  MFIter *local_a8;
  int local_9c;
  int iStack_98;
  int local_94;
  int local_8c;
  int local_88;
  int local_84;
  unique_ptr<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
  local_80;
  int local_74;
  int local_70;
  int local_6c;
  long *local_68;
  undefined4 local_5c;
  _Atomic_word *local_58;
  undefined4 local_4c;
  _Atomic_word *local_48;
  undefined4 local_3c;
  _Atomic_word *local_38;
  undefined4 local_2c;
  MFIter *local_28;
  undefined4 local_1c;
  MFIter *local_18;
  undefined4 local_c;
  MFIter *local_8;
  
  do_tiling_ = (undefined1)((ulong)in_RDI >> 0x38);
  local_100 = 0.0;
  local_ec = in_ESI;
  OverlapMask(in_stack_000000a8,in_stack_000000a0);
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                 in_stack_fffffffffffffd78,(bool)do_tiling_);
  while( true ) {
    bVar2 = MFIter::isValid(&local_168);
    comm = (MPI_Comm)((ulong)in_stack_fffffffffffffd48 >> 0x20);
    if (!bVar2) break;
    in_stack_fffffffffffffd50 = (MFIter *)(local_1e8 + 0x4c);
    MFIter::tilebox((MFIter *)in_stack_fffffffffffffdb0._M_head_impl);
    this_00 = (FabArray<amrex::FArrayBox> *)local_1e8;
    local_180._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_stack_fffffffffffffd50;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(this_00,in_stack_fffffffffffffd50);
    local_1e8._64_8_ = this_00;
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x12893a2);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(this_00,in_stack_fffffffffffffd50);
    local_d0 = (MFIter *)local_180._M_pi;
    local_8 = (MFIter *)local_180._M_pi;
    local_c = 0;
    local_c4 = *(int *)&(((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                           *)&(local_180._M_pi)->_vptr__Sp_counted_base)->_M_t).
                        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                        .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
    local_18 = (MFIter *)local_180._M_pi;
    local_1c = 1;
    iStack_c0 = *(int *)((long)&(((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                   *)&(local_180._M_pi)->_vptr__Sp_counted_base)->_M_t).
                                super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl +
                        4);
    in_stack_fffffffffffffdb0._M_head_impl =
         (((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_> *)
          &(local_180._M_pi)->_vptr__Sp_counted_base)->_M_t).
         super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
         super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
         super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
    local_28 = (MFIter *)local_180._M_pi;
    local_2c = 2;
    local_d8 = (local_180._M_pi)->_M_use_count;
    local_a8 = (MFIter *)local_180._M_pi;
    local_38 = &(local_180._M_pi)->_M_weak_count;
    local_3c = 0;
    local_9c = *local_38;
    local_48 = &(local_180._M_pi)->_M_weak_count;
    local_4c = 1;
    iStack_98 = *(int *)&local_180._M_pi[1]._vptr__Sp_counted_base;
    local_b8.hp = *(Array4<const_double> **)local_38;
    local_58 = &(local_180._M_pi)->_M_weak_count;
    local_5c = 2;
    local_b0 = *(int *)((long)&local_180._M_pi[1]._vptr__Sp_counted_base + 4);
    for (local_274 = local_d8; local_278 = iStack_c0, local_274 <= local_b0;
        local_274 = local_274 + 1) {
      for (; iVar1 = local_c4, local_278 <= iStack_98; local_278 = local_278 + 1) {
        while (iVar4 = iVar1, iVar4 <= local_9c) {
          local_80._M_t.
          super___uniq_ptr_impl<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
          .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>._M_head_impl =
               (__uniq_ptr_data<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>,_true,_true>
                )(__uniq_ptr_data<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>,_true,_true>
                  )local_1e8._64_8_;
          local_88 = local_278;
          local_8c = local_274;
          dVar3 = *(double *)
                   (*(long *)local_1e8._64_8_ +
                   ((long)(iVar4 - *(int *)(local_1e8._64_8_ + 0x20)) +
                    (long)(local_278 - *(int *)(local_1e8._64_8_ + 0x24)) *
                    *(long *)&((BoxArray *)(local_1e8._64_8_ + 8))->m_bat +
                    (long)(local_274 - *(int *)(local_1e8._64_8_ + 0x28)) *
                    *(long *)(local_1e8._64_8_ + 0x10) +
                   (long)local_ec * *(long *)(local_1e8._64_8_ + 0x18)) * 8);
          local_70 = local_278;
          local_74 = local_274;
          local_100 = (dVar3 * dVar3) /
                      *(double *)
                       (local_230 +
                       ((long)(iVar4 - local_210) + (local_278 - local_20c) * local_228 +
                       (local_274 - local_208) * local_220) * 8) + local_100;
          local_84 = iVar4;
          local_6c = iVar4;
          local_68 = &local_230;
          iVar1 = iVar4 + 1;
        }
      }
    }
    local_1f0 = &local_230;
    local_e0 = in_stack_fffffffffffffdb0._M_head_impl;
    local_bc = local_d8;
    local_94 = local_b0;
    MFIter::operator++(&local_168);
  }
  MFIter::~MFIter(in_stack_fffffffffffffd50);
  ParallelContext::CommunicatorSub();
  ParallelAllReduce::Sum<double>((double *)in_stack_fffffffffffffd50,comm);
  dVar3 = sqrt(local_100);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
             in_stack_fffffffffffffd50);
  return dVar3;
}

Assistant:

Real
MultiFab::norm2 (int comp, const Periodicity& period) const
{
    BL_PROFILE("MultiFab::norm2(period)");

    Real nm2 = Real(0.0);

    auto mask = OverlapMask(period);

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& ma = this->const_arrays();
        auto const& maskma = mask->const_arrays();
        nm2 = ParReduce(TypeList<ReduceOpSum>{}, TypeList<Real>{}, *this,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept -> GpuTuple<Real>
        {
            Real tmp = ma[box_no](i,j,k,comp);
            return tmp*tmp/maskma[box_no](i,j,k);
        });
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (!system::regtest_reduction) reduction(+:nm2)
#endif
        for (MFIter mfi(*this,true); mfi.isValid(); ++mfi)
        {
            Box const& bx = mfi.tilebox();
            auto const& a = this->const_array(mfi);
            auto const& m = mask->const_array(mfi);
            AMREX_LOOP_3D(bx, i, j, k,
            {
                Real tmp = a(i,j,k,comp);
                nm2 += tmp*tmp/m(i,j,k);
            });
        }
    }

    ParallelAllReduce::Sum(nm2, ParallelContext::CommunicatorSub());
    return std::sqrt(nm2);
}